

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_8UL> *params_1,ArrayPtr<const_char> *params_2)

{
  size_t __n;
  char *__n_00;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             (size_t)(params->ptr + *(long *)params_1->content + *(long *)(this + 8)));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __n = *(size_t *)(this + 8);
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
    __dest = __dest + __n;
  }
  __n_00 = params->ptr;
  if (__n_00 != (char *)0x0) {
    memcpy(__dest,&params->size_,(size_t)__n_00);
    __dest = __dest + (long)__n_00;
  }
  if (*(size_t *)params_1->content != 0) {
    memcpy(__dest,(void *)params_1->currentSize,*(size_t *)params_1->content);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}